

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

StringList * __thiscall
Args::HelpPrinter::createUsageString_abi_cxx11_(HelpPrinter *this,ArgIface *arg,bool required)

{
  byte bVar1;
  ulong uVar2;
  byte in_CL;
  long *in_RDX;
  StringList *in_RDI;
  String usage;
  StringList *result;
  value_type *in_stack_ffffffffffffff48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  string local_70 [48];
  string local_40 [38];
  byte local_1a;
  byte local_19;
  long *local_18;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13abe4);
  std::__cxx11::string::string(local_40);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::append((char *)local_40);
  }
  (**(code **)(*local_18 + 0x38))();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::append((char *)local_40);
    (**(code **)(*local_18 + 0x38))();
    std::__cxx11::string::append(local_40);
    (**(code **)(*local_18 + 0x40))();
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::append((char *)local_40);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__cxx11::string::clear();
    }
  }
  (**(code **)(*local_18 + 0x40))();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::append((char *)local_40);
    (**(code **)(*local_18 + 0x40))();
    std::__cxx11::string::append(local_40);
  }
  else {
    in_stack_ffffffffffffff50 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(**(code **)(*local_18 + 0x38))();
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      in_stack_ffffffffffffff48 = (value_type *)(**(code **)(*local_18 + 0x40))();
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        (**(code **)(*local_18 + 0x18))(local_70);
        std::__cxx11::string::append(local_40);
        std::__cxx11::string::~string(local_70);
      }
    }
  }
  bVar1 = (**(code **)(*local_18 + 0x20))();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::append((char *)local_40);
    (**(code **)(*local_18 + 0x48))();
    std::__cxx11::string::append(local_40);
    std::__cxx11::string::append((char *)local_40);
  }
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::append((char *)local_40);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_1a = 1;
  std::__cxx11::string::~string(local_40);
  if ((local_1a & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_ffffffffffffff50);
  }
  return in_RDI;
}

Assistant:

inline StringList
HelpPrinter::createUsageString( ArgIface * arg, bool required ) const
{
	StringList result;

	String usage;

	if( !required )
		usage.append( SL( "[ " ) );

	if( !arg->flag().empty() )
	{
		usage.append( SL( "-" ) );
		usage.append( arg->flag() );

		if( !arg->argumentName().empty() )
		{
			usage.append( SL( "," ) );

			result.push_back( usage );

			usage.clear();
		}
	}

	if( !arg->argumentName().empty() )
	{
		usage.append( SL( "--" ) );
		usage.append( arg->argumentName() );
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
		usage.append( arg->name() );

	if( arg->isWithValue() )
	{
		usage.append( SL( " <" ) );
		usage.append( arg->valueSpecifier() );
		usage.append( SL( ">" ) );
	}

	if( !required )
		usage.append( SL( " ]" ) );

	result.push_back( usage );

	return result;
}